

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

size_t utilMin(size_t n,...)

{
  char in_AL;
  size_t sVar1;
  uint uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong *puVar3;
  ulong uVar4;
  ulong *puVar5;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar6;
  undefined8 in_XMM0_Qa;
  void *in_XMM1_Qa;
  ulong local_b8 [4];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  va_list marker;
  
  local_b8[1] = in_RSI;
  local_b8[2] = in_RDX;
  local_b8[3] = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  if (in_AL != '\0') {
    uStack_88 = in_XMM0_Qa;
    marker[0].overflow_arg_area = in_XMM1_Qa;
  }
  puVar3 = (ulong *)&stack0x00000008;
  uVar2 = 8;
  sVar1 = 0xffffffffffffffff;
  while (bVar6 = n != 0, n = n - 1, bVar6) {
    if (uVar2 < 0x29) {
      uVar4 = (ulong)uVar2;
      uVar2 = uVar2 + 8;
      puVar5 = (ulong *)((long)local_b8 + uVar4);
    }
    else {
      puVar5 = puVar3;
      puVar3 = puVar3 + 1;
    }
    if (*puVar5 < sVar1) {
      sVar1 = *puVar5;
    }
  }
  return sVar1;
}

Assistant:

size_t utilMin(size_t n, ...)
{
	size_t min = SIZE_MAX;
	va_list marker;
	ASSERT(n > 0);
	va_start(marker, n);
	while (n--)
	{
		size_t current = va_arg(marker, size_t);
		if (current < min)
			min = current;
	}
	va_end(marker);
	return min;
}